

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-socket.c
# Opt level: O0

Socket * platform_make_agent_socket(Plug *plug,char *dirprefix,char **error,char **name)

{
  uint uVar1;
  int iVar2;
  __pid_t _Var3;
  char *pcVar4;
  char *dirname;
  char *pcVar5;
  SockAddr *listenaddr;
  ssize_t sVar6;
  undefined1 local_1078 [8];
  int buf [1024];
  int local_68;
  pid_t pid;
  int cleanup_pipe [2];
  Socket *sock;
  char *err;
  char *errw;
  char *socketname;
  char *socketdir;
  char *username;
  char **name_local;
  char **error_local;
  char *dirprefix_local;
  Plug *plug_local;
  
  *name = (char *)0x0;
  pcVar4 = get_username();
  dirname = dupprintf("%s.%s",dirprefix,pcVar4);
  safefree(pcVar4);
  if (*dirname != '/') {
    __assert_fail("*socketdir == \'/\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/agent-socket.c"
                  ,0x1c,"Socket *platform_make_agent_socket(Plug *, const char *, char **, char **)"
                 );
  }
  pcVar4 = make_dir_and_check_ours(dirname);
  if (pcVar4 == (char *)0x0) {
    uVar1 = getpid();
    pcVar4 = dupprintf("%s/pageant.%d",dirname,(ulong)uVar1);
    listenaddr = unix_sock_addr(pcVar4);
    cleanup_pipe = (int  [2])new_unix_listener(listenaddr,plug);
    pcVar5 = sk_socket_error((Socket *)cleanup_pipe);
    if (pcVar5 == (char *)0x0) {
      iVar2 = pipe(&local_68);
      if (iVar2 == 0) {
        _Var3 = fork();
        if (_Var3 == 0) {
          close(0);
          close(1);
          close(2);
          setpgid(0,0);
          close(pid);
          do {
            sVar6 = read(local_68,local_1078,0x1000);
          } while (0 < sVar6);
          unlink(pcVar4);
          rmdir(dirname);
          _exit(0);
        }
        if (_Var3 < 0) {
          close(local_68);
          close(pid);
        }
        else {
          close(local_68);
          cloexec(pid);
        }
      }
      *name = pcVar4;
      *error = (char *)0x0;
      safefree(dirname);
      plug_local = (Plug *)cleanup_pipe;
    }
    else {
      pcVar5 = dupprintf("%s: %s\n",pcVar4,pcVar5);
      *error = pcVar5;
      sk_close((Socket *)cleanup_pipe);
      safefree(pcVar4);
      rmdir(dirname);
      safefree(dirname);
      plug_local = (Plug *)0x0;
    }
  }
  else {
    pcVar5 = dupprintf("%s: %s\n",dirname,pcVar4);
    *error = pcVar5;
    safefree(pcVar4);
    safefree(dirname);
    plug_local = (Plug *)0x0;
  }
  return (Socket *)plug_local;
}

Assistant:

Socket *platform_make_agent_socket(
    Plug *plug, const char *dirprefix, char **error, char **name)
{
    char *username, *socketdir, *socketname, *errw;
    const char *err;
    Socket *sock;

    *name = NULL;

    username = get_username();
    socketdir = dupprintf("%s.%s", dirprefix, username);
    sfree(username);

    assert(*socketdir == '/');
    if ((errw = make_dir_and_check_ours(socketdir)) != NULL) {
        *error = dupprintf("%s: %s\n", socketdir, errw);
        sfree(errw);
        sfree(socketdir);
        return NULL;
    }

    socketname = dupprintf("%s/pageant.%d", socketdir, (int)getpid());
    sock = new_unix_listener(unix_sock_addr(socketname), plug);
    if ((err = sk_socket_error(sock)) != NULL) {
        *error = dupprintf("%s: %s\n", socketname, err);
        sk_close(sock);
        sfree(socketname);
        rmdir(socketdir);
        sfree(socketdir);
        return NULL;
    }

    /*
     * Spawn a subprocess which will try to reliably delete our socket
     * and its containing directory when we terminate, in case we die
     * unexpectedly.
     */
    {
        int cleanup_pipe[2];
        pid_t pid;

        /* Don't worry if pipe or fork fails; it's not _that_ critical. */
        if (!pipe(cleanup_pipe)) {
            if ((pid = fork()) == 0) {
                int buf[1024];
                /*
                 * Our parent process holds the writing end of
                 * this pipe, and writes nothing to it. Hence,
                 * we expect read() to return EOF as soon as
                 * that process terminates.
                 */

                close(0);
                close(1);
                close(2);

                setpgid(0, 0);
                close(cleanup_pipe[1]);
                while (read(cleanup_pipe[0], buf, sizeof(buf)) > 0);
                unlink(socketname);
                rmdir(socketdir);
                _exit(0);
            } else if (pid < 0) {
                close(cleanup_pipe[0]);
                close(cleanup_pipe[1]);
            } else {
                close(cleanup_pipe[0]);
                cloexec(cleanup_pipe[1]);
            }
        }
    }

    *name = socketname;
    *error = NULL;
    sfree(socketdir);
    return sock;
}